

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandPrintStatus(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Cex_t *pAVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Abc_Ntk_t *pNtk;
  FILE *__s;
  Vec_Ptr_t *pVVar6;
  Vec_Int_t *pVVar7;
  int i;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  size_t __size;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  char *local_40;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_40 = (char *)0x0;
  Extra_UtilGetoptReset();
  bVar4 = true;
  bVar3 = false;
  while( true ) {
    while (iVar5 = Extra_UtilGetopt(argc,argv,"Losh"), iVar5 == 0x6f) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    if (iVar5 == -1) break;
    if (iVar5 == 0x73) {
      bVar4 = (bool)(bVar4 ^ 1);
    }
    else {
      if (iVar5 != 0x4c) goto LAB_0024d39e;
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by a file name.\n");
LAB_0024d39e:
        Abc_Print(-2,"usage: print_status [-L file] [-osh]\n");
        Abc_Print(-2,"\t          prints verification status\n");
        pcVar10 = "no logging";
        if (local_40 != (char *)0x0) {
          pcVar10 = local_40;
        }
        Abc_Print(-2,"\t-L file : the log file name [default = %s]\n",pcVar10);
        pcVar11 = "yes";
        pcVar10 = "yes";
        if (!bVar3) {
          pcVar10 = "no";
        }
        Abc_Print(-2,"\t-o      : toggle printing output status [default = %s]\n",pcVar10);
        if (!bVar4) {
          pcVar11 = "no";
        }
        Abc_Print(-2,"\t-s      : toggle using short print-out [default = %s]\n",pcVar11);
        pcVar10 = "\t-h      : print the command usage\n";
        iVar5 = -2;
LAB_0024d440:
        Abc_Print(iVar5,pcVar10);
        return 1;
      }
      local_40 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
    }
  }
  if (bVar3) {
    if (pNtk != (Abc_Ntk_t *)0x0) {
      Abc_NtkPrintPoEquivs(pNtk);
      return 0;
    }
    pcVar10 = "Empty network.\n";
    iVar5 = -1;
    goto LAB_0024d440;
  }
  if (pAbc->vStatuses == (Vec_Int_t *)0x0) {
    Abc_Print(1,"Status = %d  Frames = %d   ",(ulong)(uint)pAbc->Status);
  }
  if (pAbc->pCex == (Abc_Cex_t *)0x0) {
    pVVar6 = pAbc->vCexVec;
    if (pVVar6 == (Vec_Ptr_t *)0x0) {
      Abc_Print(1,"Cex is not defined.\n");
      goto LAB_0024d19e;
    }
  }
  else {
    Abc_CexPrintStats(pAbc->pCex);
    pVVar6 = pAbc->vCexVec;
    if (pVVar6 == (Vec_Ptr_t *)0x0) goto LAB_0024d19e;
  }
  if (0 < pVVar6->nSize) {
    lVar15 = 0;
    uVar12 = 0;
    do {
      pAVar1 = (Abc_Cex_t *)pVVar6->pArray[lVar15];
      if ((Abc_Cex_t *)0x1 < pAVar1) {
        uVar12 = uVar12 + 1;
        printf("%4d : ",(ulong)uVar12);
        Abc_CexPrintStats(pAVar1);
        pVVar6 = pAbc->vCexVec;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar6->nSize);
  }
LAB_0024d19e:
  pVVar7 = pAbc->vStatuses;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (local_40 == (char *)0x0) {
      uVar12 = pVVar7->nSize;
      uVar16 = (ulong)uVar12;
      if (bVar4) {
        if ((int)uVar12 < 1) {
          uVar9 = 0;
          uVar13 = 0;
          uVar8 = 0;
        }
        else {
          piVar2 = pVVar7->pArray;
          uVar8 = 0;
          uVar13 = 0;
          do {
            uVar13 = (ulong)((int)uVar13 + (uint)(piVar2[uVar8] == 0));
            uVar8 = uVar8 + 1;
          } while (uVar16 != uVar8);
          uVar8 = 0;
          uVar9 = 0;
          do {
            uVar9 = (ulong)((int)uVar9 + (uint)(piVar2[uVar8] == 1));
            uVar8 = uVar8 + 1;
          } while (uVar16 != uVar8);
          uVar14 = 0;
          uVar8 = 0;
          do {
            uVar8 = (ulong)((int)uVar8 + (uint)(piVar2[uVar14] == -1));
            uVar14 = uVar14 + 1;
          } while (uVar16 != uVar14);
        }
        printf("Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).",uVar13,
               uVar9,uVar8);
      }
      else if (0 < (int)uVar12) {
        uVar16 = 0;
        do {
          printf("%d=%d  ",uVar16 & 0xffffffff,(ulong)(uint)pVVar7->pArray[uVar16]);
          uVar16 = uVar16 + 1;
          pVVar7 = pAbc->vStatuses;
        } while ((long)uVar16 < (long)pVVar7->nSize);
      }
    }
    else {
      __s = fopen(local_40,"wb");
      if (__s == (FILE *)0x0) {
        printf("Cannot open file \"%s\" for writing.\n",local_40);
        return 0;
      }
      pVVar6 = pAbc->vCexVec;
      if (0 < pVVar6->nSize) {
        lVar15 = 0;
        do {
          if (pAbc->vStatuses->nSize <= lVar15) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pAVar1 = (Abc_Cex_t *)pVVar6->pArray[lVar15];
          iVar5 = pAbc->vStatuses->pArray[lVar15];
          if (iVar5 == 1) {
            __size = 0xe;
            pcVar10 = "STATUS: UNSAT ";
LAB_0024d259:
            fwrite(pcVar10,__size,1,__s);
          }
          else {
            if (iVar5 == 0) {
              __size = 0xc;
              pcVar10 = "STATUS: SAT ";
              goto LAB_0024d259;
            }
            if (iVar5 == -1) {
              __size = 0x10;
              pcVar10 = "STATUS: ABORTED ";
              goto LAB_0024d259;
            }
          }
          if (pNtk->vPos->nSize <= lVar15) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pcVar10 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[lVar15]);
          fprintf(__s,"%s\n",pcVar10);
          if (iVar5 == 0) {
            Abc_NtkDumpOneCexSpecial((FILE *)__s,pNtk,pAVar1);
          }
          lVar15 = lVar15 + 1;
          pVVar6 = pAbc->vCexVec;
        } while (lVar15 < pVVar6->nSize);
      }
      fclose(__s);
    }
    putchar(10);
  }
  return 0;
}

Assistant:

int Abc_CommandPrintStatus( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkDumpOneCexSpecial( FILE * pFile, Abc_Ntk_t * pNtk, Abc_Cex_t * pCex );
    extern void Abc_NtkPrintPoEquivs( Abc_Ntk_t * pNtk );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c, fOutStatus = 0, fShort = 1;
    char * pLogFileName = NULL;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Losh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'o':
            fOutStatus ^= 1;
            break;
        case 's':
            fShort ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fOutStatus )
    {
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Empty network.\n" );
            return 1;
        }
        Abc_NtkPrintPoEquivs( pNtk );
        return 0;
    }
    if ( !pAbc->vStatuses )
        Abc_Print( 1,"Status = %d  Frames = %d   ", pAbc->Status, pAbc->nFrames );
    if ( pAbc->pCex == NULL && pAbc->vCexVec == NULL )
        Abc_Print( 1,"Cex is not defined.\n" );
    else
    {
        if ( pAbc->pCex )
            Abc_CexPrintStats( pAbc->pCex );
        if ( pAbc->vCexVec )
        {
            Abc_Cex_t * pTemp;
            int nCexes = 0;
            int Counter = 0;
            //printf( "\n" );
            Vec_PtrForEachEntry( Abc_Cex_t *, pAbc->vCexVec, pTemp, c )
            {
                if ( pTemp == (void *)(ABC_PTRINT_T)1 )
                {
                    Counter++;
                    continue;
                }
                if ( pTemp )
                {
                    printf( "%4d : ", ++nCexes );
                    Abc_CexPrintStats( pTemp );
                }
            }
//            if ( Counter )
//                printf( "In total, %d (out of %d) outputs are \"sat\" but CEXes are not recorded.\n", Counter, Vec_PtrSize(pAbc->vCexVec) );
        }
    }
    if ( pAbc->vStatuses )
    {
        if ( pLogFileName )
        {
            Abc_Cex_t * pTemp = NULL;
            FILE * pFile = fopen( pLogFileName, "wb" );
            if ( pFile == NULL )
            {
                printf( "Cannot open file \"%s\" for writing.\n", pLogFileName );
                return 0;
            }
            Vec_PtrForEachEntry( Abc_Cex_t *, pAbc->vCexVec, pTemp, c )
            {
                int Status = Vec_IntEntry( pAbc->vStatuses, c );
                if ( Status == -1 ) // undec
                    fprintf( pFile, "STATUS: ABORTED " );
                else if ( Status == 0 )
                    fprintf( pFile, "STATUS: SAT " );
                else if ( Status == 1 )
                    fprintf( pFile, "STATUS: UNSAT " );
                fprintf( pFile, "%s\n", Abc_ObjName(Abc_NtkPo(pNtk, c)) );
                if ( Status != 0 )
                    continue;
                Abc_NtkDumpOneCexSpecial( pFile, pNtk, pTemp );
            }
            fclose( pFile );
        }
        else if ( fShort )
        {
            printf( "Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).",
                Vec_IntCountEntry(pAbc->vStatuses, 0), Vec_IntCountEntry(pAbc->vStatuses, 1),
                Vec_IntCountEntry(pAbc->vStatuses, -1), Vec_IntSize(pAbc->vStatuses) );
        }
        else
        {
            int i, Entry;
            Vec_IntForEachEntry( pAbc->vStatuses, Entry, i )
                printf( "%d=%d  ", i, Entry );
        }
        printf( "\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_status [-L file] [-osh]\n" );
    Abc_Print( -2, "\t          prints verification status\n" );
    Abc_Print( -2, "\t-L file : the log file name [default = %s]\n",  pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-o      : toggle printing output status [default = %s]\n", fOutStatus? "yes": "no" );
    Abc_Print( -2, "\t-s      : toggle using short print-out [default = %s]\n", fShort? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}